

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void vdbeFreeOpArray(sqlite3 *db,Op *aOp,int nOp)

{
  Op *local_28;
  Op *pOp;
  int nOp_local;
  Op *aOp_local;
  sqlite3 *db_local;
  
  if (aOp != (Op *)0x0) {
    local_28 = aOp + (nOp + -1);
    while( true ) {
      if (local_28->p4type < -5) {
        freeP4(db,(int)local_28->p4type,(local_28->p4).p);
      }
      if (local_28 == aOp) break;
      local_28 = local_28 + -1;
    }
    sqlite3DbNNFreeNN(db,aOp);
  }
  return;
}

Assistant:

static void vdbeFreeOpArray(sqlite3 *db, Op *aOp, int nOp){
  assert( nOp>=0 );
  assert( db!=0 );
  if( aOp ){
    Op *pOp = &aOp[nOp-1];
    while(1){  /* Exit via break */
      if( pOp->p4type <= P4_FREE_IF_LE ) freeP4(db, pOp->p4type, pOp->p4.p);
#ifdef SQLITE_ENABLE_EXPLAIN_COMMENTS
      sqlite3DbFree(db, pOp->zComment);
#endif
      if( pOp==aOp ) break;
      pOp--;
    }
    sqlite3DbNNFreeNN(db, aOp);
  }
}